

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

IMultiMerger * __thiscall
BamTools::Internal::BamMultiReaderPrivate::CreateAlignmentCache(BamMultiReaderPrivate *this)

{
  MergeOrder MVar1;
  __type _Var2;
  IMultiMerger *pIVar3;
  undefined **ppuVar4;
  SamHeader header;
  
  if (this->m_hasUserMergeOrder == false) {
    GetHeader(&header,this);
    _Var2 = std::operator==(&header.SortOrder,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            Constants::SAM_HD_SORTORDER_COORDINATE_abi_cxx11_);
    if (_Var2) {
      this->m_mergeOrder = MergeByCoordinate;
    }
    else {
      _Var2 = std::operator==(&header.SortOrder,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Constants::SAM_HD_SORTORDER_QUERYNAME_abi_cxx11_);
      if (_Var2) {
        this->m_mergeOrder = MergeByName;
      }
      else {
        this->m_mergeOrder = RoundRobinMerge;
      }
    }
    SamHeader::~SamHeader(&header);
  }
  MVar1 = this->m_mergeOrder;
  if (MVar1 == RoundRobinMerge) {
    pIVar3 = (IMultiMerger *)operator_new(0x58);
    pIVar3->_vptr_IMultiMerger = (_func_int **)&PTR__MultiMerger_001f2360;
    std::_Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
    ::_Deque_base((_Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                   *)(pIVar3 + 1));
  }
  else {
    if (MVar1 == MergeByCoordinate) {
      ppuVar4 = &PTR__MultiMerger_001f23e0;
    }
    else {
      if (MVar1 != MergeByName) {
        return (IMultiMerger *)0x0;
      }
      ppuVar4 = &PTR__MultiMerger_001f2450;
    }
    pIVar3 = (IMultiMerger *)operator_new(0x38);
    pIVar3->_vptr_IMultiMerger = (_func_int **)ppuVar4;
    *(undefined4 *)&pIVar3[1]._vptr_IMultiMerger = 0;
    *(undefined4 *)&pIVar3[2]._vptr_IMultiMerger = 0;
    pIVar3[3]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar3[4]._vptr_IMultiMerger = (_func_int **)(pIVar3 + 2);
    pIVar3[5]._vptr_IMultiMerger = (_func_int **)(pIVar3 + 2);
    pIVar3[6]._vptr_IMultiMerger = (_func_int **)0x0;
  }
  return pIVar3;
}

Assistant:

IMultiMerger* BamMultiReaderPrivate::CreateAlignmentCache()
{

    // if no merge order set explicitly, use SAM header to lookup proper order
    if (!m_hasUserMergeOrder) {

        // fetch SamHeader from BAM files
        SamHeader header = GetHeader();

        // if BAM files are sorted by position
        if (header.SortOrder == Constants::SAM_HD_SORTORDER_COORDINATE)
            m_mergeOrder = BamMultiReader::MergeByCoordinate;

        // if BAM files are sorted by read name
        else if (header.SortOrder == Constants::SAM_HD_SORTORDER_QUERYNAME)
            m_mergeOrder = BamMultiReader::MergeByName;

        // otherwise, sorting is either "unknown" or marked as "unsorted"
        else
            m_mergeOrder = BamMultiReader::RoundRobinMerge;
    }

    // use current merge order to create proper 'multi-merger'
    switch (m_mergeOrder) {

        // merge BAM files by position
        case BamMultiReader::MergeByCoordinate:
            return new MultiMerger<Algorithms::Sort::ByPosition>();

        // merge BAM files by read name
        case BamMultiReader::MergeByName:
            return new MultiMerger<Algorithms::Sort::ByName>();

        // sorting is "unknown", "unsorted" or "ignored"... so use unsorted merger
        case BamMultiReader::RoundRobinMerge:
            return new MultiMerger<Algorithms::Sort::Unsorted>();

        // unknown merge order, can't create merger
        default:
            return 0;
    }
}